

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O3

double __thiscall ON_Localizer::Value(ON_Localizer *this,double t)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ON_Interval::NormalizedParameterAt(&this->m_d,t);
  dVar2 = 0.0;
  if ((0.0 < dVar1) && (dVar2 = 1.0, dVar1 < 1.0)) {
    dVar2 = (3.0 - (dVar1 + dVar1)) * dVar1 * dVar1;
  }
  return dVar2;
}

Assistant:

double ON_Localizer::Value(double t) const
{
  double s = m_d.NormalizedParameterAt(t);
  if ( s <= 0.0 )
    s = 0.0;
  else if ( s >= 1.0 )
    s = 1.0;
  else
    s = s*s*(3.0 - 2.0*s);

  return s;
}